

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O3

bool s_eqi(string *s1,string *s2)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar2 = (uint)s1->_M_string_length;
  uVar5 = (uint)s2->_M_string_length;
  uVar8 = uVar5;
  if ((int)uVar2 < (int)uVar5) {
    uVar8 = uVar2;
  }
  if (0 < (int)uVar8) {
    uVar9 = 0;
    do {
      cVar1 = (s1->_M_dataplus)._M_p[uVar9];
      cVar6 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar6 = cVar1;
      }
      cVar1 = (s2->_M_dataplus)._M_p[uVar9];
      cVar7 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar7 = cVar1;
      }
      if (cVar6 != cVar7) {
        return false;
      }
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if ((int)uVar5 < (int)uVar2) {
    lVar4 = 0;
    do {
      bVar10 = (s1->_M_dataplus)._M_p[lVar4 + (int)uVar5] == ' ';
      if (!bVar10) {
        return bVar10;
      }
      iVar3 = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (~uVar5 + uVar2 != iVar3);
  }
  else {
    bVar10 = true;
    if ((int)uVar2 < (int)uVar5) {
      lVar4 = 0;
      do {
        bVar10 = (s2->_M_dataplus)._M_p[lVar4 + (int)uVar2] == ' ';
        if (!bVar10) {
          return bVar10;
        }
        iVar3 = (int)lVar4;
        lVar4 = lVar4 + 1;
      } while (~uVar2 + uVar5 != iVar3);
    }
  }
  return bVar10;
}

Assistant:

bool ppmb_write_test ( string file_name )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_WRITE_TEST tests the binary portable pixel map write routines.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    11 April 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, string FILE_NAME, the name of the file to contain the binary
//    portable pixel map data.
//
//    Output, bool PPMB_WRITE_TEST is true if an error occurred.
//
{
  unsigned char *b;
  bool error;
  unsigned char *g;
  int maxrgb;
  unsigned char *r;
  int xsize;
  int ysize;

  xsize = 200;
  ysize = 200;
//
//  Allocate memory.
// 
  r = new unsigned char[ xsize * ysize ];
  g = new unsigned char[ xsize * ysize ];
  b = new unsigned char[ xsize * ysize ];
//
//  Set the data.
//
  error = ppmb_example ( xsize, ysize, r, g, b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPM_EXAMPLE failed.\n";
    return true;
  }
//
//  Write the data to the file.
//
  error = ppmb_write ( file_name, xsize, ysize, r, g, b );

  delete [] r;
  delete [] g;
  delete [] b;

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPMB_WRITE failed.\n";
    return true;
  }

  return false;
}